

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O2

string * __thiscall
soul::ASTUtilities::getTypeArraySignature_abi_cxx11_
          (string *__return_storage_ptr__,ASTUtilities *this,TypeArray *types)

{
  void *o;
  long lVar1;
  Type *this_00;
  Type *pTVar2;
  Type t;
  Type local_88;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::to_string(__return_storage_ptr__,*(unsigned_long *)(this + 8));
  pTVar2 = *(Type **)this;
  for (lVar1 = *(long *)(this + 8) * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    if (pTVar2->category == structure) {
      Type::getStruct(&local_88);
      getSignatureString_abi_cxx11_
                (&local_70,
                 (ASTUtilities *)
                 CONCAT44(local_88.primitiveType.type,CONCAT22(local_88._2_2_,local_88._0_2_)),o);
      std::operator+(&local_50,"_",&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_88;
    }
    else {
      Type::Type(&local_88,pTVar2);
      local_88.isRef = false;
      local_88.isConstant = false;
      Type::getShortIdentifierDescription_abi_cxx11_(&local_70,&local_88);
      std::operator+(&local_50,"_",&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = (Type *)&local_88.structure;
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)this_00);
    pTVar2 = pTVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getTypeArraySignature (const AST::TypeArray& types)
    {
        auto result = std::to_string (types.size());

        for (auto& t : types)
        {
            if (t.isStruct())
                result += "_" + getSignatureString (t.getStruct().get());
            else
                result += "_" + t.withConstAndRefFlags (false, false).getShortIdentifierDescription();
        }

        return result;
    }